

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

void opj_thread_pool_destroy(opj_thread_pool_t *tp)

{
  opj_worker_thread_list_t *poVar1;
  opj_worker_thread_list_t *ptr;
  long lVar2;
  long lVar3;
  
  if (tp != (opj_thread_pool_t *)0x0) {
    if (tp->cond != (opj_cond_t *)0x0) {
      lVar2 = 0;
      opj_thread_pool_wait_completion(tp,0);
      pthread_mutex_lock((pthread_mutex_t *)tp->mutex);
      tp->state = OPJWTS_STOP;
      pthread_mutex_unlock((pthread_mutex_t *)tp->mutex);
      for (lVar3 = 0; lVar3 < tp->worker_threads_count; lVar3 = lVar3 + 1) {
        pthread_mutex_lock(*(pthread_mutex_t **)((long)&tp->worker_threads->mutex + lVar2));
        opj_cond_signal(*(opj_cond_t **)((long)&tp->worker_threads->cond + lVar2));
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)&tp->worker_threads->mutex + lVar2));
        opj_thread_join(*(opj_thread_t **)((long)&tp->worker_threads->thread + lVar2));
        opj_cond_destroy(*(opj_cond_t **)((long)&tp->worker_threads->cond + lVar2));
        opj_mutex_destroy(*(opj_mutex_t **)((long)&tp->worker_threads->mutex + lVar2));
        lVar2 = lVar2 + 0x28;
      }
      opj_free(tp->worker_threads);
      ptr = tp->waiting_worker_thread_list;
      while (ptr != (opj_worker_thread_list_t *)0x0) {
        poVar1 = ptr->next;
        opj_free(ptr);
        tp->waiting_worker_thread_list = poVar1;
        ptr = poVar1;
      }
      opj_cond_destroy(tp->cond);
    }
    opj_mutex_destroy(tp->mutex);
    opj_tls_destroy(tp->tls);
    opj_free(tp);
    return;
  }
  return;
}

Assistant:

void opj_thread_pool_destroy(opj_thread_pool_t* tp)
{
    if (!tp) {
        return;
    }
    if (tp->cond) {
        int i;
        opj_thread_pool_wait_completion(tp, 0);

        opj_mutex_lock(tp->mutex);
        tp->state = OPJWTS_STOP;
        opj_mutex_unlock(tp->mutex);

        for (i = 0; i < tp->worker_threads_count; i++) {
            opj_mutex_lock(tp->worker_threads[i].mutex);
            opj_cond_signal(tp->worker_threads[i].cond);
            opj_mutex_unlock(tp->worker_threads[i].mutex);
            opj_thread_join(tp->worker_threads[i].thread);
            opj_cond_destroy(tp->worker_threads[i].cond);
            opj_mutex_destroy(tp->worker_threads[i].mutex);
        }

        opj_free(tp->worker_threads);

        while (tp->waiting_worker_thread_list != NULL) {
            opj_worker_thread_list_t* next = tp->waiting_worker_thread_list->next;
            opj_free(tp->waiting_worker_thread_list);
            tp->waiting_worker_thread_list = next;
        }

        opj_cond_destroy(tp->cond);
    }
    opj_mutex_destroy(tp->mutex);
    opj_tls_destroy(tp->tls);
    opj_free(tp);
}